

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::MergeFrom(Message *this,Message *from)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  LogMessage *this_00;
  LogMessage *other;
  Descriptor *descriptor;
  Message *in_stack_00000398;
  Message *in_stack_000003a0;
  string *in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff60;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  pDVar1 = GetDescriptor((Message *)in_stack_ffffffffffffff50);
  pDVar2 = GetDescriptor((Message *)in_stack_ffffffffffffff50);
  if (pDVar2 != pDVar1) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff60,level,(char *)in_stack_ffffffffffffff50,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    Descriptor::full_name_abi_cxx11_(pDVar1);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    pDVar1 = GetDescriptor((Message *)in_stack_ffffffffffffff50);
    this_00 = (LogMessage *)Descriptor::full_name_abi_cxx11_(pDVar1);
    other = internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff48);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x44783b);
  }
  internal::ReflectionOps::Merge(in_stack_000003a0,in_stack_00000398);
  return;
}

Assistant:

void Message::MergeFrom(const Message& from) {
  const Descriptor* descriptor = GetDescriptor();
  GOOGLE_CHECK_EQ(from.GetDescriptor(), descriptor)
      << ": Tried to merge from a message with a different type.  "
         "to: "
      << descriptor->full_name()
      << ", "
         "from: "
      << from.GetDescriptor()->full_name();
  ReflectionOps::Merge(from, this);
}